

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall amrex::Amr::writePlotFile(Amr *this)

{
  ostringstream *this_00;
  ostream *poVar1;
  char local_1b9;
  string local_1b8;
  Print local_198;
  
  if ((anonymous_namespace)::plot_files_output == '\x01') {
    if (first_plotfile == '\x01') {
      first_plotfile = '\0';
      (**(code **)(*(long *)(((this->amr_level).
                              super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                  + 0x118))();
    }
    if (_DAT_00843758 != 0) {
      Concatenate(&local_1b8,&this->plot_file_root,
                  *(this->level_steps).super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start,this->file_name_digits);
      if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
        local_198.os = OutStream();
        local_198.rank = *(int *)(DAT_00842950 + -0x30);
        this_00 = &local_198.ss;
        local_198.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) =
             *(undefined8 *)(local_198.os + *(long *)(*(long *)local_198.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"PLOTFILE: file = ",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
        local_1b9 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_1b9,1);
        Print::~Print(&local_198);
      }
      if ((this->record_run_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&this->runlog,"PLOTFILE: file = ",0x11);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&this->runlog,local_1b8._M_dataplus._M_p,
                            local_1b8._M_string_length);
        local_198.rank = CONCAT31(local_198.rank._1_3_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_198,1);
      }
      writePlotFileDoit(this,&local_1b8,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void
Amr::writePlotFile ()
{
    if ( ! Plot_Files_Output()) {
        return;
    }

    BL_PROFILE_REGION_START("Amr::writePlotFile()");
    BL_PROFILE("Amr::writePlotFile()");

    if (first_plotfile) {
        first_plotfile = false;
        amr_level[0]->setPlotVariables();
    }

    // Don't continue if we have no variables to plot.

    if (statePlotVars().size() == 0) {
        return;
    }

    const std::string& pltfile = amrex::Concatenate(plot_file_root,
                                                    level_steps[0],
                                                    file_name_digits);

    if (verbose > 0) {
        amrex::Print() << "PLOTFILE: file = " << pltfile << '\n';
    }

    if (record_run_info && ParallelDescriptor::IOProcessor()) {
        runlog << "PLOTFILE: file = " << pltfile << '\n';
    }

    writePlotFileDoit(pltfile, true);

    BL_PROFILE_REGION_STOP("Amr::writePlotFile()");
}